

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

APInt __thiscall llvm::detail::DoubleAPFloat::bitcastToAPInt(DoubleAPFloat *this)

{
  anon_union_8_2_1313ab2f_for_U aVar1;
  undefined8 extraout_RDX;
  long *in_RSI;
  APInt AVar2;
  uint64_t Data [2];
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  anon_union_8_2_1313ab2f_for_U local_30;
  uint local_28;
  
  if ((undefined1 *)*in_RSI == semPPCDoubleDouble) {
    APFloat::bitcastToAPInt((APFloat *)&local_30);
    aVar1.pVal = (uint64_t *)&local_30;
    if (0x40 < local_28) {
      aVar1 = local_30;
    }
    Data[0] = *aVar1.pVal;
    APFloat::bitcastToAPInt((APFloat *)&local_40);
    aVar1.pVal = (uint64_t *)&local_40;
    if (0x40 < local_38) {
      aVar1 = local_40;
    }
    Data[1] = *aVar1.pVal;
    APInt::~APInt((APInt *)&local_40);
    APInt::~APInt((APInt *)&local_30);
    APInt::APInt((APInt *)this,0x80,2,Data);
    AVar2._8_8_ = extraout_RDX;
    AVar2.U.pVal = (uint64_t *)this;
    return AVar2;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x10b2,"APInt llvm::detail::DoubleAPFloat::bitcastToAPInt() const");
}

Assistant:

APInt DoubleAPFloat::bitcastToAPInt() const {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  uint64_t Data[] = {
      Floats[0].bitcastToAPInt().getRawData()[0],
      Floats[1].bitcastToAPInt().getRawData()[0],
  };
  return APInt(128, 2, Data);
}